

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_file.cpp
# Opt level: O1

void __thiscall cppcms::http::file::impl_data::impl_data(impl_data *this)

{
  *(code **)&this->fb = booster::locale::ios_info::domain_id;
  *(undefined8 *)&(this->fb).field_0x8 = 0;
  *(undefined8 *)&(this->fb).field_0x10 = 0;
  *(undefined8 *)&(this->fb).field_0x18 = 0;
  *(undefined8 *)&(this->fb).field_0x20 = 0;
  *(undefined8 *)&(this->fb).field_0x28 = 0;
  *(undefined8 *)&(this->fb).field_0x30 = 0;
  std::locale::locale((locale *)&(this->fb).field_0x38);
  *(undefined ***)&this->fb = &PTR__file_buffer_002893b8;
  (this->fb).in_memory_ = true;
  (this->fb).f_ = (FILE *)0x0;
  (this->fb).limit_ = 0;
  (this->fb).file_size_ = 0;
  (this->fb).read_offset_ = 0;
  (this->fb).input_.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->fb).input_.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->fb).input_.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->fb).output_.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->fb).output_.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->fb).output_.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->fb).data_.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->fb).data_.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->fb).data_.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->fb).temp_dir_._M_dataplus._M_p = (pointer)&(this->fb).temp_dir_.field_2;
  (this->fb).temp_dir_._M_string_length = 0;
  (this->fb).temp_dir_.field_2._M_local_buf[0] = '\0';
  (this->fb).name_._M_dataplus._M_p = (pointer)&(this->fb).name_.field_2;
  (this->fb).name_._M_string_length = 0;
  (this->fb).name_.field_2._M_local_buf[0] = '\0';
  (this->fb).closed_ = false;
  *(undefined8 *)&(this->fb).field_0x8 = 0;
  *(undefined8 *)&(this->fb).field_0x10 = 0;
  *(undefined8 *)&(this->fb).field_0x18 = 0;
  *(undefined8 *)&(this->fb).field_0x20 = 0;
  *(undefined8 *)&(this->fb).field_0x28 = 0;
  *(undefined8 *)&(this->fb).field_0x30 = 0;
  std::istream::istream(&this->in,(streambuf *)this);
  std::ostream::ostream(&this->out,(streambuf *)this);
  return;
}

Assistant:

impl_data() :
		in(&fb),
		out(&fb)
	{
	}